

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O0

QSize __thiscall QScrollArea::viewportSizeHint(QScrollArea *this)

{
  bool bVar1;
  undefined4 uVar2;
  QScrollAreaPrivate *pQVar3;
  QWidget *pQVar4;
  long in_FS_OFFSET;
  int h;
  QScrollAreaPrivate *d;
  QWidget *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  QFontMetrics local_18 [8];
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QScrollArea *)0x679baa);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x679bc0);
  if (bVar1) {
    if ((pQVar3->resizable & 1U) == 0) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x679c06);
      local_10 = QWidget::size(in_stack_ffffffffffffffb8);
    }
    else {
      pQVar4 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x679be5);
      local_10 = (QSize)(**(code **)(*(long *)pQVar4 + 0x70))();
    }
  }
  else {
    QWidget::fontMetrics(in_stack_ffffffffffffffb8);
    uVar2 = QFontMetrics::height();
    QFontMetrics::~QFontMetrics(local_18);
    QSize::QSize((QSize *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),
                 (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QScrollArea::viewportSizeHint() const
{
    Q_D(const QScrollArea);
    if (d->widget) {
        return d->resizable ? d->widget->sizeHint() : d->widget->size();
    }
    const int h = fontMetrics().height();
    return QSize(6 * h, 4 * h);
}